

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O0

object boost::python::
       make_function<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::default_call_policies,boost::python::detail::keywords<0ul>>
                 (first_type f,default_call_policies *policies,keywords<0UL> *keywords_or_signature)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  object_base in_RDI;
  undefined8 in_R8;
  
  detail::
  make_function_dispatch<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::default_call_policies,boost::python::detail::keywords<0ul>>
            (in_RDI.m_ptr,in_RSI,in_RDX,in_RCX,in_R8);
  return (object)(object_base)in_RDI.m_ptr;
}

Assistant:

object make_function(
    F f
  , CallPolicies const& policies
  , KeywordsOrSignature const& keywords_or_signature)
{
    typedef typename
        detail::is_reference_to_keywords<KeywordsOrSignature&>::type
        is_kw;
    
    return detail::make_function_dispatch(
        f
      , policies
      , keywords_or_signature
      , is_kw()
    );
}